

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

tests * lest::make_tests<lest::test[2]>(tests *__return_storage_ptr__,test (*c) [2])

{
  test *in_RCX;
  vector<lest::test,_std::allocator<lest::test>_> local_58;
  vector<lest::test,_std::allocator<lest::test>_> local_38;
  
  make<std::vector<lest::test,std::allocator<lest::test>>,lest::test>
            (&local_38,(lest *)c,c[1],in_RCX);
  local_58.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_58.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_38);
  (__return_storage_ptr__->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_58.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_58.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_58.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_58.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

inline int run( tests const & specification, int argc, char ** argv, std::ostream & os = std::cout )
{
    return run( specification, make_texts( argv + 1, argv + argc ), os  );
}